

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.c
# Opt level: O2

void export_results(double **results,uint total_experiments)

{
  tm *__tp;
  time_t timer;
  char time_representation [64];
  char filename [64];
  char result_to_string [131072];
  
  filename[0x30] = '\0';
  filename[0x31] = '\0';
  filename[0x32] = '\0';
  filename[0x33] = '\0';
  filename[0x34] = '\0';
  filename[0x35] = '\0';
  filename[0x36] = '\0';
  filename[0x37] = '\0';
  filename[0x38] = '\0';
  filename[0x39] = '\0';
  filename[0x3a] = '\0';
  filename[0x3b] = '\0';
  filename[0x3c] = '\0';
  filename[0x3d] = '\0';
  filename[0x3e] = '\0';
  filename[0x3f] = '\0';
  filename[0x20] = '\0';
  filename[0x21] = '\0';
  filename[0x22] = '\0';
  filename[0x23] = '\0';
  filename[0x24] = '\0';
  filename[0x25] = '\0';
  filename[0x26] = '\0';
  filename[0x27] = '\0';
  filename[0x28] = '\0';
  filename[0x29] = '\0';
  filename[0x2a] = '\0';
  filename[0x2b] = '\0';
  filename[0x2c] = '\0';
  filename[0x2d] = '\0';
  filename[0x2e] = '\0';
  filename[0x2f] = '\0';
  filename[0x10] = '\0';
  filename[0x11] = '\0';
  filename[0x12] = '\0';
  filename[0x13] = '\0';
  filename[0x14] = '\0';
  filename[0x15] = '\0';
  filename[0x16] = '\0';
  filename[0x17] = '\0';
  filename[0x18] = '\0';
  filename[0x19] = '\0';
  filename[0x1a] = '\0';
  filename[0x1b] = '\0';
  filename[0x1c] = '\0';
  filename[0x1d] = '\0';
  filename[0x1e] = '\0';
  filename[0x1f] = '\0';
  filename[0] = '\0';
  filename[1] = '\0';
  filename[2] = '\0';
  filename[3] = '\0';
  filename[4] = '\0';
  filename[5] = '\0';
  filename[6] = '\0';
  filename[7] = '\0';
  filename[8] = '\0';
  filename[9] = '\0';
  filename[10] = '\0';
  filename[0xb] = '\0';
  filename[0xc] = '\0';
  filename[0xd] = '\0';
  filename[0xe] = '\0';
  filename[0xf] = '\0';
  time_representation[0x30] = '\0';
  time_representation[0x31] = '\0';
  time_representation[0x32] = '\0';
  time_representation[0x33] = '\0';
  time_representation[0x34] = '\0';
  time_representation[0x35] = '\0';
  time_representation[0x36] = '\0';
  time_representation[0x37] = '\0';
  time_representation[0x38] = '\0';
  time_representation[0x39] = '\0';
  time_representation[0x3a] = '\0';
  time_representation[0x3b] = '\0';
  time_representation[0x3c] = '\0';
  time_representation[0x3d] = '\0';
  time_representation[0x3e] = '\0';
  time_representation[0x3f] = '\0';
  time_representation[0x20] = '\0';
  time_representation[0x21] = '\0';
  time_representation[0x22] = '\0';
  time_representation[0x23] = '\0';
  time_representation[0x24] = '\0';
  time_representation[0x25] = '\0';
  time_representation[0x26] = '\0';
  time_representation[0x27] = '\0';
  time_representation[0x28] = '\0';
  time_representation[0x29] = '\0';
  time_representation[0x2a] = '\0';
  time_representation[0x2b] = '\0';
  time_representation[0x2c] = '\0';
  time_representation[0x2d] = '\0';
  time_representation[0x2e] = '\0';
  time_representation[0x2f] = '\0';
  time_representation[0x10] = '\0';
  time_representation[0x11] = '\0';
  time_representation[0x12] = '\0';
  time_representation[0x13] = '\0';
  time_representation[0x14] = '\0';
  time_representation[0x15] = '\0';
  time_representation[0x16] = '\0';
  time_representation[0x17] = '\0';
  time_representation[0x18] = '\0';
  time_representation[0x19] = '\0';
  time_representation[0x1a] = '\0';
  time_representation[0x1b] = '\0';
  time_representation[0x1c] = '\0';
  time_representation[0x1d] = '\0';
  time_representation[0x1e] = '\0';
  time_representation[0x1f] = '\0';
  time_representation[0] = '\0';
  time_representation[1] = '\0';
  time_representation[2] = '\0';
  time_representation[3] = '\0';
  time_representation[4] = '\0';
  time_representation[5] = '\0';
  time_representation[6] = '\0';
  time_representation[7] = '\0';
  time_representation[8] = '\0';
  time_representation[9] = '\0';
  time_representation[10] = '\0';
  time_representation[0xb] = '\0';
  time_representation[0xc] = '\0';
  time_representation[0xd] = '\0';
  time_representation[0xe] = '\0';
  time_representation[0xf] = '\0';
  memset(result_to_string,0,0x20000);
  timer = time((time_t *)0x0);
  __tp = localtime(&timer);
  strftime(time_representation,0x40,"%G_%b_%d_%H-%M-%S",__tp);
  export_results_to_string(results,total_experiments,result_to_string);
  mkdir("results",0x1c0);
  snprintf(filename,0x40,"results/%s_results.csv",time_representation);
  rewrite_file(filename,result_to_string);
  return;
}

Assistant:

void export_results (double *const * results, unsigned total_experiments) {
  char filename[MAX_FILENAME_SIZE] = "";
  char time_representation[MAX_FILENAME_SIZE] = "";
  char result_to_string[MAX_BUFFER_SIZE] = "";

  struct tm * time_info;
  time_t timer = time(NULL);

  time_info = localtime (&timer);
  strftime (time_representation, MAX_FILENAME_SIZE, "%G_%b_%d_%H-%M-%S", time_info);

  export_results_to_string (results, total_experiments, result_to_string);
  // might be cross-platform issues
  mkdir ("results", S_IRWXU);
  snprintf (filename, MAX_FILENAME_SIZE, "results/%s_results.csv", time_representation);

  rewrite_file (filename, result_to_string);

#ifdef ALTERNATIVE_OUTPUT
  printf(FANCY_INFO "Results saved to file `%s'.\n", filename);
#endif /* ALTERNATIVE_OUTPUT */

  return;
}